

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_robust_access_pass.cpp
# Opt level: O0

Instruction * __thiscall
spvtools::opt::GraphicsRobustAccessPass::MakeRuntimeArrayLengthInst
          (GraphicsRobustAccessPass *this,Instruction *access_chain,uint32_t operand_index)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<spvtools::opt::Operand> __l;
  undefined4 result_id;
  Op OVar1;
  uint32_t uVar2;
  int iVar3;
  StorageClass storage_class;
  IRContext *pIVar4;
  TypeManager *this_00;
  Instruction *this_01;
  Operand *pOVar5;
  ulong uVar6;
  size_type sVar7;
  uint64_t uVar8;
  Type *pTVar9;
  undefined4 extraout_var;
  DiagnosticStream *this_02;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  *this_03;
  tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  tVar10;
  Operand *local_480;
  uint local_448;
  allocator<spvtools::opt::Operand> local_435;
  uint local_434;
  iterator local_430;
  undefined8 local_428;
  SmallVector<unsigned_int,_2UL> local_420;
  uint32_t local_3f4;
  iterator local_3f0;
  undefined8 local_3e8;
  SmallVector<unsigned_int,_2UL> local_3e0;
  Operand local_3b8;
  Operand OStack_388;
  iterator local_358;
  _func_int **local_350;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_348;
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_330;
  Instruction *array_len;
  Type *uint_type;
  Integer uint_type_for_query;
  uint32_t array_len_id;
  uint32_t member_index_of_runtime_array;
  Struct *struct_type;
  Type *pointee_type;
  DiagnosticStream local_2b8;
  Instruction *local_e0;
  Instruction *new_access_chain;
  uint32_t new_access_chain_id;
  uint32_t new_access_chain_type_id;
  Type *new_access_chain_result_pointee_type;
  Type *base_pointee_type;
  Pointer *base_ptr_type;
  Constant *index_constant;
  Instruction *index;
  uint32_t index_for_type_calculation;
  uint32_t i_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices_for_type;
  ConstantManager *constant_mgr;
  uint32_t i;
  uint32_t num_indices_to_keep;
  OperandList ops;
  int base_operand;
  Instruction *base;
  uint32_t num_contributing_indices;
  int first_index_operand;
  Instruction *pointer_to_containing_struct;
  Instruction *current_access_chain;
  uint32_t steps_remaining;
  TypeManager *type_mgr;
  uint32_t operand_index_local;
  Instruction *access_chain_local;
  GraphicsRobustAccessPass *this_local;
  
  pIVar4 = Pass::context(&this->super_Pass);
  this_00 = IRContext::get_type_mgr(pIVar4);
  current_access_chain._4_4_ = 2;
  _num_contributing_indices = (Instruction *)0x0;
  pointer_to_containing_struct = access_chain;
  while( true ) {
    while( true ) {
      if (current_access_chain._4_4_ == 0) {
        if (_num_contributing_indices != (Instruction *)0x0) {
          uVar2 = Instruction::type_id(_num_contributing_indices);
          pTVar9 = analysis::TypeManager::GetType(this_00,uVar2);
          iVar3 = (*pTVar9->_vptr_Type[0x1f])();
          pTVar9 = analysis::Pointer::pointee_type((Pointer *)CONCAT44(extraout_var_00,iVar3));
          iVar3 = (*pTVar9->_vptr_Type[0x1c])();
          this_03 = analysis::Struct::element_types((Struct *)CONCAT44(extraout_var_01,iVar3));
          sVar7 = std::
                  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                  ::size(this_03);
          uint_type_for_query._44_4_ = (int)sVar7 + -1;
          uint_type_for_query._40_4_ = Pass::TakeNextId(&this->super_Pass);
          analysis::Integer::Integer((Integer *)&uint_type,0x20,false);
          array_len = (Instruction *)
                      analysis::TypeManager::GetRegisteredType(this_00,(Type *)&uint_type);
          uVar2 = analysis::TypeManager::GetId(this_00,(Type *)array_len);
          result_id = uint_type_for_query._40_4_;
          local_3f4 = Instruction::result_id(_num_contributing_indices);
          local_3f0 = &local_3f4;
          local_3e8 = 1;
          init_list_00._M_len = 1;
          init_list_00._M_array = local_3f0;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_3e0,init_list_00);
          Operand::Operand(&local_3b8,SPV_OPERAND_TYPE_ID,&local_3e0);
          local_434 = uint_type_for_query._44_4_;
          local_430 = &local_434;
          local_428 = 1;
          init_list._M_len = 1;
          init_list._M_array = local_430;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_420,init_list);
          Operand::Operand(&OStack_388,SPV_OPERAND_TYPE_LITERAL_INTEGER,&local_420);
          local_358 = &local_3b8;
          local_350 = (_func_int **)0x2;
          std::allocator<spvtools::opt::Operand>::allocator(&local_435);
          __l._M_len = (size_type)local_350;
          __l._M_array = local_358;
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                    (&local_348,__l,&local_435);
          tVar10.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl = (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )InsertInst(this,access_chain,OpArrayLength,uVar2,result_id,&local_348);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                    (&local_348);
          std::allocator<spvtools::opt::Operand>::~allocator(&local_435);
          local_480 = (Operand *)&local_358;
          do {
            local_480 = local_480 + -1;
            Operand::~Operand(local_480);
          } while (local_480 != &local_3b8);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_420);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_3e0);
          local_330._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )(tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            )tVar10.
                             super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             .
                             super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                             ._M_head_impl;
          analysis::Integer::~Integer((Integer *)&uint_type);
          return (Instruction *)
                 (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )tVar10.
                   super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   .
                   super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                   ._M_head_impl;
        }
        __assert_fail("pointer_to_containing_struct",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/graphics_robust_access_pass.cpp"
                      ,0x308,
                      "Instruction *spvtools::opt::GraphicsRobustAccessPass::MakeRuntimeArrayLengthInst(Instruction *, uint32_t)"
                     );
      }
      OVar1 = Instruction::opcode(pointer_to_containing_struct);
      if (1 < OVar1 - OpAccessChain) break;
      if (pointer_to_containing_struct == access_chain) {
        local_448 = operand_index - 2;
      }
      else {
        uVar2 = Instruction::NumInOperands(pointer_to_containing_struct);
        local_448 = uVar2 - 1;
      }
      uVar2 = Instruction::GetSingleWordInOperand(pointer_to_containing_struct,0);
      this_01 = GetDef(this,uVar2);
      if (local_448 == current_access_chain._4_4_) {
        current_access_chain._4_4_ = 0;
        _num_contributing_indices = this_01;
      }
      else if (local_448 < current_access_chain._4_4_) {
        current_access_chain._4_4_ = current_access_chain._4_4_ - local_448;
        pointer_to_containing_struct = this_01;
      }
      else {
        ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 2;
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&i);
        pOVar5 = Instruction::GetOperand(pointer_to_containing_struct,2);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&i,
                   pOVar5);
        for (constant_mgr._0_4_ = 0;
            (uint)constant_mgr <= (local_448 - current_access_chain._4_4_) - 1;
            constant_mgr._0_4_ = (uint)constant_mgr + 1) {
          pOVar5 = Instruction::GetOperand(pointer_to_containing_struct,(uint)constant_mgr + 3);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                    ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&i,
                     pOVar5);
        }
        pIVar4 = Pass::context(&this->super_Pass);
        indices_for_type.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)IRContext::get_constant_mgr(pIVar4);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &index_for_type_calculation);
        for (index._4_4_ = 0; uVar6 = (ulong)index._4_4_,
            sVar7 = std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
                    size((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                         &i), uVar6 < sVar7 - 1; index._4_4_ = index._4_4_ + 1) {
          index._0_4_ = 0;
          uVar2 = Instruction::GetSingleWordOperand(pointer_to_containing_struct,index._4_4_ + 3);
          index_constant = (Constant *)GetDef(this,uVar2);
          base_ptr_type =
               (Pointer *)
               analysis::ConstantManager::GetConstantFromInst
                         ((ConstantManager *)
                          indices_for_type.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(Instruction *)index_constant);
          if (base_ptr_type == (Pointer *)0x0) {
            index._0_4_ = 0;
          }
          else {
            uVar8 = analysis::Constant::GetZeroExtendedValue((Constant *)base_ptr_type);
            index._0_4_ = (undefined4)uVar8;
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &index_for_type_calculation,(value_type_conflict2 *)&index);
        }
        uVar2 = Instruction::type_id(this_01);
        pTVar9 = analysis::TypeManager::GetType(this_00,uVar2);
        iVar3 = (*pTVar9->_vptr_Type[0x1f])();
        base_pointee_type = (Type *)CONCAT44(extraout_var,iVar3);
        new_access_chain_result_pointee_type =
             analysis::Pointer::pointee_type((Pointer *)base_pointee_type);
        _new_access_chain_id =
             analysis::TypeManager::GetMemberType
                       (this_00,new_access_chain_result_pointee_type,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &index_for_type_calculation);
        uVar2 = analysis::TypeManager::GetId(this_00,_new_access_chain_id);
        storage_class = analysis::Pointer::storage_class((Pointer *)base_pointee_type);
        new_access_chain._4_4_ =
             analysis::TypeManager::FindPointerToType(this_00,uVar2,storage_class);
        new_access_chain._0_4_ = Pass::TakeNextId(&this->super_Pass);
        OVar1 = Instruction::opcode(pointer_to_containing_struct);
        _num_contributing_indices =
             InsertInst(this,pointer_to_containing_struct,OVar1,new_access_chain._4_4_,
                        (uint32_t)new_access_chain,(OperandList *)&i);
        current_access_chain._4_4_ = 0;
        local_e0 = _num_contributing_indices;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &index_for_type_calculation);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&i);
      }
    }
    if (OVar1 != OpCopyObject) break;
    uVar2 = Instruction::GetSingleWordInOperand(pointer_to_containing_struct,0);
    pointer_to_containing_struct = GetDef(this,uVar2);
  }
  Fail(&local_2b8,this);
  this_02 = DiagnosticStream::operator<<
                      (&local_2b8,
                       (char (*) [66])
                       "Unhandled access chain in logical addressing mode passes through ");
  Instruction::PrettyPrint_abi_cxx11_((string *)&pointee_type,pointer_to_containing_struct,0x50);
  DiagnosticStream::operator<<
            (this_02,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &pointee_type);
  std::__cxx11::string::~string((string *)&pointee_type);
  DiagnosticStream::~DiagnosticStream(&local_2b8);
  return (Instruction *)0x0;
}

Assistant:

Instruction* GraphicsRobustAccessPass::MakeRuntimeArrayLengthInst(
    Instruction* access_chain, uint32_t operand_index) {
  // The Index parameter to the access chain at |operand_index| is indexing
  // *into* the runtime-array.  To get the number of elements in the runtime
  // array we need a pointer to the Block-decorated struct that contains the
  // runtime array. So conceptually we have to go 2 steps backward in the
  // access chain.  The two steps backward might forces us to traverse backward
  // across multiple dominating instructions.
  auto* type_mgr = context()->get_type_mgr();

  // How many access chain indices do we have to unwind to find the pointer
  // to the struct containing the runtime array?
  uint32_t steps_remaining = 2;
  // Find or create an instruction computing the pointer to the structure
  // containing the runtime array.
  // Walk backward through pointer address calculations until we either get
  // to exactly the right base pointer, or to an access chain instruction
  // that we can replicate but truncate to compute the address of the right
  // struct.
  Instruction* current_access_chain = access_chain;
  Instruction* pointer_to_containing_struct = nullptr;
  while (steps_remaining > 0) {
    switch (current_access_chain->opcode()) {
      case spv::Op::OpCopyObject:
        // Whoops. Walk right through this one.
        current_access_chain =
            GetDef(current_access_chain->GetSingleWordInOperand(0));
        break;
      case spv::Op::OpAccessChain:
      case spv::Op::OpInBoundsAccessChain: {
        const int first_index_operand = 3;
        // How many indices in this access chain contribute to getting us
        // to an element in the runtime array?
        const auto num_contributing_indices =
            current_access_chain == access_chain
                ? operand_index - (first_index_operand - 1)
                : current_access_chain->NumInOperands() - 1 /* skip the base */;
        Instruction* base =
            GetDef(current_access_chain->GetSingleWordInOperand(0));
        if (num_contributing_indices == steps_remaining) {
          // The base pointer points to the structure.
          pointer_to_containing_struct = base;
          steps_remaining = 0;
          break;
        } else if (num_contributing_indices < steps_remaining) {
          // Peel off the index and keep going backward.
          steps_remaining -= num_contributing_indices;
          current_access_chain = base;
        } else {
          // This access chain has more indices than needed.  Generate a new
          // access chain instruction, but truncating the list of indices.
          const int base_operand = 2;
          // We'll use the base pointer and the indices up to but not including
          // the one indexing into the runtime array.
          Instruction::OperandList ops;
          // Use the base pointer
          ops.push_back(current_access_chain->GetOperand(base_operand));
          const uint32_t num_indices_to_keep =
              num_contributing_indices - steps_remaining - 1;
          for (uint32_t i = 0; i <= num_indices_to_keep; i++) {
            ops.push_back(
                current_access_chain->GetOperand(first_index_operand + i));
          }
          // Compute the type of the result of the new access chain.  Start at
          // the base and walk the indices in a forward direction.
          auto* constant_mgr = context()->get_constant_mgr();
          std::vector<uint32_t> indices_for_type;
          for (uint32_t i = 0; i < ops.size() - 1; i++) {
            uint32_t index_for_type_calculation = 0;
            Instruction* index =
                GetDef(current_access_chain->GetSingleWordOperand(
                    first_index_operand + i));
            if (auto* index_constant =
                    constant_mgr->GetConstantFromInst(index)) {
              // We only need 32 bits. For the type calculation, it's sufficient
              // to take the zero-extended value. It only matters for the struct
              // case, and struct member indices are unsigned.
              index_for_type_calculation =
                  uint32_t(index_constant->GetZeroExtendedValue());
            } else {
              // Indexing into a variably-sized thing like an array.  Use 0.
              index_for_type_calculation = 0;
            }
            indices_for_type.push_back(index_for_type_calculation);
          }
          auto* base_ptr_type = type_mgr->GetType(base->type_id())->AsPointer();
          auto* base_pointee_type = base_ptr_type->pointee_type();
          auto* new_access_chain_result_pointee_type =
              type_mgr->GetMemberType(base_pointee_type, indices_for_type);
          const uint32_t new_access_chain_type_id = type_mgr->FindPointerToType(
              type_mgr->GetId(new_access_chain_result_pointee_type),
              base_ptr_type->storage_class());

          // Create the instruction and insert it.
          const auto new_access_chain_id = TakeNextId();
          auto* new_access_chain =
              InsertInst(current_access_chain, current_access_chain->opcode(),
                         new_access_chain_type_id, new_access_chain_id, ops);
          pointer_to_containing_struct = new_access_chain;
          steps_remaining = 0;
          break;
        }
      } break;
      default:
        Fail() << "Unhandled access chain in logical addressing mode passes "
                  "through "
               << current_access_chain->PrettyPrint(
                      SPV_BINARY_TO_TEXT_OPTION_SHOW_BYTE_OFFSET |
                      SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES);
        return nullptr;
    }
  }
  assert(pointer_to_containing_struct);
  auto* pointee_type =
      type_mgr->GetType(pointer_to_containing_struct->type_id())
          ->AsPointer()
          ->pointee_type();

  auto* struct_type = pointee_type->AsStruct();
  const uint32_t member_index_of_runtime_array =
      uint32_t(struct_type->element_types().size() - 1);
  // Create the length-of-array instruction before the original access chain,
  // but after the generation of the pointer to the struct.
  const auto array_len_id = TakeNextId();
  analysis::Integer uint_type_for_query(32, false);
  auto* uint_type = type_mgr->GetRegisteredType(&uint_type_for_query);
  auto* array_len = InsertInst(
      access_chain, spv::Op::OpArrayLength, type_mgr->GetId(uint_type),
      array_len_id,
      {{SPV_OPERAND_TYPE_ID, {pointer_to_containing_struct->result_id()}},
       {SPV_OPERAND_TYPE_LITERAL_INTEGER, {member_index_of_runtime_array}}});
  return array_len;
}